

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O1

Vec_Ptr_t *
findNextLevelDisjunctiveMonotone
          (Aig_Man_t *pAig,aigPoIndices *aigPoIndicesInstance,
          antecedentConsequentVectorsStruct *anteConsecInstance,Vec_Ptr_t *previousMonotoneVectors)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  Vec_Ptr_t *pVVar6;
  Vec_Int_t *p;
  antecedentConsequentVectorsStruct *anteConseVectors;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Vec_Int_t *p_00;
  int *__dest;
  void **ppvVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  p = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 0;
  pVVar6->nSize = 0;
  pVVar6->pArray = (void **)0x0;
  p->nCap = 0;
  p->nSize = 0;
  p->pArray = (int *)0x0;
  if (0 < previousMonotoneVectors->nSize) {
    lVar13 = 0;
    do {
      pvVar5 = previousMonotoneVectors->pArray[lVar13];
      if (0 < *(int *)((long)pvVar5 + 4)) {
        lVar11 = 0;
        do {
          Vec_IntPushUniqueLocal(p,*(int *)(*(long *)((long)pvVar5 + 8) + lVar11 * 4));
          lVar11 = lVar11 + 1;
        } while (lVar11 < *(int *)((long)pvVar5 + 4));
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < previousMonotoneVectors->nSize);
  }
  if (0 < previousMonotoneVectors->nSize) {
    lVar13 = 0;
    do {
      pvVar5 = previousMonotoneVectors->pArray[lVar13];
      anteConseVectors = (antecedentConsequentVectorsStruct *)malloc(0x10);
      anteConseVectors->attrAntecedents = (Vec_Int_t *)0x0;
      anteConseVectors->attrConsequentCandidates = (Vec_Int_t *)0x0;
      pVVar7 = (Vec_Int_t *)malloc(0x10);
      iVar1 = *(int *)((long)pvVar5 + 4);
      lVar11 = (long)iVar1;
      pVVar7->nSize = iVar1;
      pVVar7->nCap = iVar1;
      if (lVar11 == 0) {
        piVar8 = (int *)0x0;
      }
      else {
        piVar8 = (int *)malloc(lVar11 * 4);
      }
      pVVar7->pArray = piVar8;
      memcpy(piVar8,*(void **)((long)pvVar5 + 8),lVar11 << 2);
      anteConseVectors->attrAntecedents = pVVar7;
      pVVar7 = vectorDifference(anteConsecInstance->attrConsequentCandidates,p);
      anteConseVectors->attrConsequentCandidates = pVVar7;
      if (pVVar7 == (Vec_Int_t *)0x0) {
        __assert_fail("vDiffVector",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/disjunctiveMonotone.c"
                      ,0x1db,
                      "Vec_Ptr_t *findNextLevelDisjunctiveMonotone(Aig_Man_t *, struct aigPoIndices *, struct antecedentConsequentVectorsStruct *, Vec_Ptr_t *)"
                     );
      }
      pVVar7 = findNewDisjunctiveMonotone(pAig,aigPoIndicesInstance,anteConseVectors);
      if (pVVar7 != (Vec_Int_t *)0x0) {
        iVar1 = pVVar7->nSize;
        if (0 < (long)iVar1) {
          piVar8 = pVVar7->pArray;
          lVar11 = 0;
          do {
            iVar10 = piVar8[lVar11];
            p_00 = (Vec_Int_t *)malloc(0x10);
            iVar2 = *(int *)((long)pvVar5 + 4);
            lVar12 = (long)iVar2;
            p_00->nSize = iVar2;
            p_00->nCap = iVar2;
            if (lVar12 == 0) {
              __dest = (int *)0x0;
            }
            else {
              __dest = (int *)malloc(lVar12 * 4);
            }
            p_00->pArray = __dest;
            memcpy(__dest,*(void **)((long)pvVar5 + 8),lVar12 << 2);
            Vec_IntPush(p_00,iVar10);
            uVar3 = pVVar6->nSize;
            uVar4 = pVVar6->nCap;
            if (uVar3 == uVar4) {
              if ((int)uVar4 < 0x10) {
                if (pVVar6->pArray == (void **)0x0) {
                  ppvVar9 = (void **)malloc(0x80);
                }
                else {
                  ppvVar9 = (void **)realloc(pVVar6->pArray,0x80);
                }
                iVar10 = 0x10;
              }
              else {
                iVar10 = uVar4 * 2;
                if (iVar10 <= (int)uVar4) goto LAB_005b09e3;
                if (pVVar6->pArray == (void **)0x0) {
                  ppvVar9 = (void **)malloc((ulong)uVar4 << 4);
                }
                else {
                  ppvVar9 = (void **)realloc(pVVar6->pArray,(ulong)uVar4 << 4);
                }
              }
              pVVar6->pArray = ppvVar9;
              pVVar6->nCap = iVar10;
            }
LAB_005b09e3:
            pVVar6->nSize = uVar3 + 1;
            pVVar6->pArray[(int)uVar3] = p_00;
            lVar11 = lVar11 + 1;
          } while (iVar1 != lVar11);
        }
        if (pVVar7->pArray != (int *)0x0) {
          free(pVVar7->pArray);
          pVVar7->pArray = (int *)0x0;
        }
        free(pVVar7);
      }
      deallocAntecedentConsequentVectorsStruct(anteConseVectors);
      lVar13 = lVar13 + 1;
    } while (lVar13 < previousMonotoneVectors->nSize);
  }
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  return pVVar6;
}

Assistant:

Vec_Ptr_t *findNextLevelDisjunctiveMonotone( 
		Aig_Man_t *pAig, 
		struct aigPoIndices *aigPoIndicesInstance, 
		struct antecedentConsequentVectorsStruct *anteConsecInstance, 
		Vec_Ptr_t *previousMonotoneVectors )
{
	Vec_Ptr_t *newLevelPtrVec;
	Vec_Int_t *vElem, *vNewDisjunctVector, *newDisjunction;
	int i, j, iElem;
	struct antecedentConsequentVectorsStruct *anteConsecInstanceLocal;
	Vec_Int_t *vUnionPrevMonotoneVector, *vDiffVector;

	newLevelPtrVec = Vec_PtrAlloc(0);
	vUnionPrevMonotoneVector = Vec_IntAlloc(0);
	Vec_PtrForEachEntry(Vec_Int_t *, previousMonotoneVectors, vElem, i)
		Vec_IntForEachEntry( vElem, iElem, j )
			Vec_IntPushUniqueLocal( vUnionPrevMonotoneVector, iElem );

	Vec_PtrForEachEntry(Vec_Int_t *, previousMonotoneVectors, vElem, i)
	{
		anteConsecInstanceLocal = allocAntecedentConsequentVectorsStruct();

		anteConsecInstanceLocal->attrAntecedents = Vec_IntDup(vElem);	
		vDiffVector = vectorDifference( anteConsecInstance->attrConsequentCandidates, vUnionPrevMonotoneVector);
		anteConsecInstanceLocal->attrConsequentCandidates = vDiffVector;
		assert( vDiffVector );

		//printf("Calling target function %d\n", i);
		vNewDisjunctVector = findNewDisjunctiveMonotone( pAig, aigPoIndicesInstance, anteConsecInstanceLocal );

		if( vNewDisjunctVector )
		{
			Vec_IntForEachEntry(vNewDisjunctVector, iElem, j)
			{
				newDisjunction = Vec_IntDup(vElem);
				Vec_IntPush( newDisjunction, iElem );
				Vec_PtrPush( newLevelPtrVec, newDisjunction );
			}
			Vec_IntFree(vNewDisjunctVector);
		}
		deallocAntecedentConsequentVectorsStruct( anteConsecInstanceLocal );
	}

	Vec_IntFree(vUnionPrevMonotoneVector);

	return newLevelPtrVec;
}